

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O2

QRect QHighDpi::toNativeWindowGeometry<QRect,QWindow>(QRect *value,QWindow *context)

{
  undefined1 auVar1 [12];
  bool bVar2;
  ulong uVar3;
  uint in_ECX;
  ulong uVar4;
  QRect QVar5;
  ScaleAndOrigin SVar6;
  
  uVar4 = 0;
  auVar1._4_8_ = 0;
  auVar1._0_4_ = in_ECX;
  SVar6 = QHighDpiScaling::scaleAndOrigin
                    ((QHighDpiScaling *)context,(QWindow *)0x0,(Point)(auVar1 << 0x40));
  uVar3 = 0;
  if (context != (QWindow *)0x0) {
    bVar2 = QWindow::isTopLevel(context);
    if (bVar2) {
      uVar4 = (ulong)SVar6.origin & 0xffffffff00000000;
      uVar3 = (ulong)SVar6.origin & 0xffffffff;
    }
    else {
      uVar4 = 0;
      uVar3 = 0;
    }
  }
  QVar5 = scale(value,SVar6.factor,(QPoint)(uVar4 | uVar3));
  return QVar5;
}

Assistant:

T toNativeWindowGeometry(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    QPoint effectiveOrigin = (context && context->isTopLevel()) ? so.origin : QPoint(0,0);
    return scale(value, so.factor, effectiveOrigin);
}